

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O1

int Abc_NtkRenodeEvalCnf(If_Man_t *p,If_Cut_t *pCut)

{
  uint *puVar1;
  int iVar2;
  word *pwVar3;
  Vec_Mem_t *pVVar4;
  Vec_Int_t *vMemory;
  uint uVar5;
  word *pwVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  
  uVar10 = *(uint *)&pCut->field_0x1c >> 0x18;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    memset(&pCut[1].Area + uVar10,1,(ulong)(uVar10 - 1) + 1);
  }
  uVar9 = pCut->iCutFunc;
  if ((int)uVar9 < 0) {
LAB_002fee78:
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                  ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  pwVar3 = p->puTempW;
  pVVar4 = p->vTtMem[uVar10];
  if (pVVar4 == (Vec_Mem_t *)0x0) {
    pwVar6 = (word *)0x0;
  }
  else {
    uVar5 = uVar9 >> 1;
    if (pVVar4->nEntries <= (int)uVar5) goto LAB_002fee97;
    pwVar6 = pVVar4->ppPages[uVar5 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
             (ulong)(uVar5 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
  }
  uVar10 = p->nTruth6Words[uVar10];
  if ((uVar9 & 1) == 0) {
    if (0 < (int)uVar10) {
      uVar8 = 0;
      do {
        pwVar3[uVar8] = pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
    }
  }
  else if (0 < (int)uVar10) {
    uVar8 = 0;
    do {
      pwVar3[uVar8] = ~pwVar6[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  uVar10 = Kit_TruthIsop((uint *)pwVar3,(uint)(byte)pCut->field_0x1f,s_vMemory,0);
  vMemory = s_vMemory;
  iVar11 = 0xfff;
  if (uVar10 != 0xffffffff) {
    if (1 < uVar10) {
      __assert_fail("RetValue == 0 || RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                    ,0x108,"int Abc_NtkRenodeEvalCnf(If_Man_t *, If_Cut_t *)");
    }
    uVar10 = pCut->iCutFunc;
    if ((int)uVar10 < 0) goto LAB_002fee78;
    iVar2 = s_vMemory->nSize;
    pwVar3 = p->puTempW;
    pVVar4 = p->vTtMem[(byte)pCut->field_0x1f];
    if (pVVar4 == (Vec_Mem_t *)0x0) {
      pwVar6 = (word *)0x0;
    }
    else {
      uVar9 = uVar10 >> 1;
      if (pVVar4->nEntries <= (int)uVar9) goto LAB_002fee97;
      pwVar6 = pVVar4->ppPages[uVar9 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
               (ulong)(uVar9 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
    }
    uVar9 = p->nTruth6Words[(byte)pCut->field_0x1f];
    if ((uVar10 & 1) == 0) {
      if (0 < (int)uVar9) {
        uVar8 = 0;
        do {
          pwVar3[uVar8] = pwVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
    }
    else if (0 < (int)uVar9) {
      uVar8 = 0;
      do {
        pwVar3[uVar8] = ~pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    pVVar4 = p->vTtMem[(byte)pCut->field_0x1f];
    if (pVVar4 == (Vec_Mem_t *)0x0) {
      pwVar6 = (word *)0x0;
    }
    else {
      uVar9 = uVar10 >> 1;
      if (pVVar4->nEntries <= (int)uVar9) goto LAB_002fee97;
      pwVar6 = pVVar4->ppPages[uVar9 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
               (ulong)(uVar9 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
    }
    uVar9 = p->nTruth6Words[(byte)pCut->field_0x1f];
    if ((uVar10 & 1) == 0) {
      if (0 < (int)uVar9) {
        uVar8 = 0;
        do {
          pwVar3[uVar8] = pwVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
    }
    else if (0 < (int)uVar9) {
      uVar8 = 0;
      do {
        pwVar3[uVar8] = ~pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    uVar8 = (ulong)(uint)(1 << ((char)(*(uint *)&pCut->field_0x1c >> 0x18) - 5U & 0x1f));
    if (*(uint *)&pCut->field_0x1c < 0x6000000) {
      uVar8 = 1;
    }
    if (0 < (int)uVar8) {
      lVar7 = uVar8 + 1;
      do {
        puVar1 = (uint *)((long)pwVar3 + lVar7 * 4 + -8);
        *puVar1 = ~*puVar1;
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    uVar10 = pCut->iCutFunc;
    if ((int)uVar10 < 0) goto LAB_002fee78;
    pVVar4 = p->vTtMem[(byte)pCut->field_0x1f];
    if (pVVar4 == (Vec_Mem_t *)0x0) {
      pwVar6 = (word *)0x0;
    }
    else {
      uVar9 = uVar10 >> 1;
      if (pVVar4->nEntries <= (int)uVar9) goto LAB_002fee97;
      pwVar6 = pVVar4->ppPages[uVar9 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
               (ulong)(uVar9 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
    }
    uVar9 = p->nTruth6Words[(byte)pCut->field_0x1f];
    if ((uVar10 & 1) == 0) {
      if (0 < (int)uVar9) {
        uVar8 = 0;
        do {
          pwVar3[uVar8] = pwVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
    }
    else if (0 < (int)uVar9) {
      uVar8 = 0;
      do {
        pwVar3[uVar8] = ~pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    uVar9 = Kit_TruthIsop((uint *)pwVar3,(uint)(byte)pCut->field_0x1f,vMemory,0);
    uVar10 = pCut->iCutFunc;
    if ((int)uVar10 < 0) goto LAB_002fee78;
    pwVar3 = p->puTempW;
    pVVar4 = p->vTtMem[(byte)pCut->field_0x1f];
    if (pVVar4 == (Vec_Mem_t *)0x0) {
      pwVar6 = (word *)0x0;
    }
    else {
      uVar5 = uVar10 >> 1;
      if (pVVar4->nEntries <= (int)uVar5) goto LAB_002fee97;
      pwVar6 = pVVar4->ppPages[uVar5 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
               (ulong)(uVar5 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
    }
    uVar5 = p->nTruth6Words[(byte)pCut->field_0x1f];
    if ((uVar10 & 1) == 0) {
      if (0 < (int)uVar5) {
        uVar8 = 0;
        do {
          pwVar3[uVar8] = pwVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
    }
    else if (0 < (int)uVar5) {
      uVar8 = 0;
      do {
        pwVar3[uVar8] = ~pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    pVVar4 = p->vTtMem[(byte)pCut->field_0x1f];
    if (pVVar4 == (Vec_Mem_t *)0x0) {
      pwVar6 = (word *)0x0;
    }
    else {
      uVar5 = uVar10 >> 1;
      if (pVVar4->nEntries <= (int)uVar5) {
LAB_002fee97:
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
      pwVar6 = pVVar4->ppPages[uVar5 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
               (ulong)(uVar5 & pVVar4->PageMask) * (long)pVVar4->nEntrySize;
    }
    uVar5 = p->nTruth6Words[(byte)pCut->field_0x1f];
    if ((uVar10 & 1) == 0) {
      if (0 < (int)uVar5) {
        uVar8 = 0;
        do {
          pwVar3[uVar8] = pwVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
    }
    else if (0 < (int)uVar5) {
      uVar8 = 0;
      do {
        pwVar3[uVar8] = ~pwVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    uVar10 = 1 << ((char)(*(uint *)&pCut->field_0x1c >> 0x18) - 5U & 0x1f);
    if (*(uint *)&pCut->field_0x1c < 0x6000000) {
      uVar10 = 1;
    }
    if (0 < (int)uVar10) {
      lVar7 = (ulong)uVar10 + 1;
      do {
        puVar1 = (uint *)((long)pwVar3 + lVar7 * 4 + -8);
        *puVar1 = ~*puVar1;
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    if (uVar9 != 0xffffffff) {
      if (1 < uVar9) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                      ,0x110,"int Abc_NtkRenodeEvalCnf(If_Man_t *, If_Cut_t *)");
      }
      iVar11 = iVar2 + s_vMemory->nSize;
    }
  }
  return iVar11;
}

Assistant:

int Abc_NtkRenodeEvalCnf( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int i, RetValue, nClauses;
    // set internal mapper parameters
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = 1;
    // compute ISOP for the positive phase
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory, 0 );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    nClauses = Vec_IntSize( s_vMemory );
    // compute ISOP for the negative phase
    Kit_TruthNot( If_CutTruth(p, pCut), If_CutTruth(p, pCut), If_CutLeaveNum(pCut) );
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory, 0 );
    Kit_TruthNot( If_CutTruth(p, pCut), If_CutTruth(p, pCut), If_CutLeaveNum(pCut) );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    nClauses += Vec_IntSize( s_vMemory );
    return nClauses;
}